

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_oh qpdf_oh_new_binary_unicode_string(qpdf_data qpdf,char *utf8_str,size_t length)

{
  ulong uVar1;
  size_t sVar2;
  char *qpdf_00;
  qpdf_oh qVar3;
  allocator local_51;
  string local_50;
  QPDFObjectHandle local_30;
  ulong local_20;
  size_t length_local;
  char *utf8_str_local;
  qpdf_data qpdf_local;
  
  local_20 = length;
  length_local = (size_t)utf8_str;
  utf8_str_local = (char *)qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_oh_new_binary_unicode_string",0);
  qpdf_00 = utf8_str_local;
  sVar2 = length_local;
  uVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,(char *)sVar2,uVar1,&local_51);
  QPDFObjectHandle::newUnicodeString(&local_30,&local_50);
  qVar3 = new_object((qpdf_data)qpdf_00,&local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return qVar3;
}

Assistant:

qpdf_oh
qpdf_oh_new_binary_unicode_string(qpdf_data qpdf, char const* utf8_str, size_t length)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_oh_new_binary_unicode_string");
    return new_object(qpdf, QPDFObjectHandle::newUnicodeString(std::string(utf8_str, length)));
}